

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsGetModuleHostInfo(JsModuleRecord requestModule,JsModuleHostInfoKind moduleHostInfo,void **hostInfo
                   )

{
  anon_class_24_3_8dd2aba2 fn;
  bool bVar1;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  JsrtContext *newContext;
  JsErrorCode errorCode;
  JsrtContext *jsrtContext;
  ScriptContext *scriptContext;
  SourceTextModuleRecord *moduleRecord;
  void **hostInfo_local;
  JsModuleRecord pvStack_18;
  JsModuleHostInfoKind moduleHostInfo_local;
  JsModuleRecord requestModule_local;
  
  moduleRecord = (SourceTextModuleRecord *)hostInfo;
  hostInfo_local._4_4_ = moduleHostInfo;
  pvStack_18 = requestModule;
  bVar1 = Js::SourceTextModuleRecord::Is(requestModule);
  if ((bVar1) && (moduleRecord != (SourceTextModuleRecord *)0x0)) {
    (moduleRecord->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject = (_func_int **)0x0;
    scriptContext = (ScriptContext *)Js::SourceTextModuleRecord::FromHost(pvStack_18);
    this = Js::SourceTextModuleRecord::GetScriptContext((SourceTextModuleRecord *)scriptContext);
    this_00 = Js::ScriptContext::GetLibrary(this);
    newContext = (JsrtContext *)Js::JavascriptLibrary::GetJsrtContext(this_00);
    fn.moduleRecord = (SourceTextModuleRecord **)&scriptContext;
    fn.moduleHostInfo = (JsModuleHostInfoKind *)((long)&hostInfo_local + 4);
    fn.hostInfo = (void ***)&moduleRecord;
    requestModule_local._4_4_ = SetContextAPIWrapper<JsGetModuleHostInfo::__0>(newContext,fn);
  }
  else {
    requestModule_local._4_4_ = JsErrorInvalidArgument;
  }
  return requestModule_local._4_4_;
}

Assistant:

CHAKRA_API
JsGetModuleHostInfo(
    _In_  JsModuleRecord requestModule,
    _In_ JsModuleHostInfoKind moduleHostInfo,
    _Outptr_result_maybenull_ void** hostInfo)
{
    if (!Js::SourceTextModuleRecord::Is(requestModule) || (hostInfo == nullptr))
    {
        return JsErrorInvalidArgument;
    }
    *hostInfo = nullptr;
    Js::SourceTextModuleRecord* moduleRecord = Js::SourceTextModuleRecord::FromHost(requestModule);
    Js::ScriptContext* scriptContext = moduleRecord->GetScriptContext();
    JsrtContext* jsrtContext = (JsrtContext*)scriptContext->GetLibrary()->GetJsrtContext();
    JsErrorCode errorCode = SetContextAPIWrapper(jsrtContext, [&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        JsrtContextCore* currentContext = static_cast<JsrtContextCore*>(JsrtContextCore::GetCurrent());
        switch (moduleHostInfo)
        {
        case JsModuleHostInfo_Exception:
            if (moduleRecord->GetErrorObject() != nullptr)
            {
                *hostInfo = moduleRecord->GetErrorObject();
            }
            break;
        case JsModuleHostInfo_HostDefined:
            *hostInfo = moduleRecord->GetHostDefined();
            break;
        case JsModuleHostInfo_FetchImportedModuleCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetFetchImportedModuleCallback());
            break;
        case JsModuleHostInfo_FetchImportedModuleFromScriptCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetFetchImportedModuleFromScriptCallback());
            break;
        case JsModuleHostInfo_NotifyModuleReadyCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetNotifyModuleReadyCallback());
            break;
        case JsModuleHostInfo_InitializeImportMetaCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetInitializeImportMetaCallback());
            break;
        case JsModuleHostInfo_ReportModuleCompletionCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetReportModuleCompletionCallback());
            break;
        case JsModuleHostInfo_Url:
            *hostInfo = reinterpret_cast<void*>(moduleRecord->GetSpecifier());
            break;
        default:
            return JsInvalidModuleHostInfoKind;
        };
        return JsNoError;
    });
    return errorCode;
}